

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys_test.cpp
# Opt level: O2

void __thiscall jbcoin::tests::ValidatorKeys_test::testRevoke(ValidatorKeys_test *this)

{
  int iVar1;
  reference_const_type puVar2;
  reference_const_type lhs;
  TypedField<jbcoin::STBlob> *f;
  SF_Blob *in_R8;
  value_type keyType;
  optional<unsigned_int> seq;
  STObject st;
  string manifest;
  string revocation;
  ValidatorKeys keys;
  optional<jbcoin::Slice> pk;
  SerialIter sit;
  bool local_155;
  KeyType local_154;
  Slice local_150;
  long local_140;
  type local_138;
  STObject local_130;
  string local_100;
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  size_type local_b8;
  uint8_t local_b0 [40];
  SecretKey local_88;
  optional<jbcoin::Slice> local_60;
  SerialIter local_48;
  
  std::__cxx11::string::string((string *)local_c0,"Revoke",(allocator *)&local_130);
  beast::unit_test::suite::testcase_t::operator()
            (&(this->super_suite).testcase,(string *)local_c0,no_abort_on_fail);
  std::__cxx11::string::~string((string *)local_c0);
  for (local_140 = 0x328; local_140 != 0x330; local_140 = local_140 + 4) {
    local_154 = *(KeyType *)((long)&(this->super_suite)._vptr_suite + local_140);
    ValidatorKeys::ValidatorKeys((ValidatorKeys *)local_c0,&local_154);
    ValidatorKeys::revoke_abi_cxx11_((ValidatorKeys *)local_e0,(char *)local_c0);
    STObject::STObject(&local_130,(SField *)sfGeneric);
    beast::detail::base64_decode<void>(&local_100,(string *)local_e0);
    SerialIter::SerialIter(&local_48,local_100._M_dataplus._M_p,local_100._M_string_length);
    STObject::set(&local_130,&local_48,0);
    local_138 = (type)get<unsigned_int,jbcoin::STInteger<unsigned_int>>
                                (&local_130,
                                 (TypedField<jbcoin::STInteger<unsigned_int>_> *)sfSequence);
    beast::unit_test::suite::expect<boost::optional<unsigned_int>>
              (&this->super_suite,(optional<unsigned_int> *)&local_138,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0xfa);
    puVar2 = boost::optional<unsigned_int>::get((optional<unsigned_int> *)&local_138);
    local_60.super_type.m_initialized = *puVar2 == 0xffffffff;
    f = (TypedField<jbcoin::STBlob> *)0xfb;
    beast::unit_test::suite::expect<bool>
              (&this->super_suite,(bool *)&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0xfb);
    get<jbcoin::Slice,jbcoin::STBlob>(&local_60,(jbcoin *)&local_130,(STObject *)sfPublicKey,f);
    beast::unit_test::suite::expect<boost::optional<jbcoin::Slice>>
              (&this->super_suite,&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0xfe);
    lhs = boost::optional<jbcoin::Slice>::get(&local_60);
    local_150.data_ = local_b0;
    local_150.size_ = local_b8;
    local_155 = jbcoin::operator==(lhs,&local_150);
    beast::unit_test::suite::expect<bool>
              (&this->super_suite,&local_155,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0xff);
    iVar1 = verify((jbcoin *)&local_130,(STObject *)&HashPrefix::manifest,(HashPrefix *)&local_b8,
                   (PublicKey *)sfMasterSignature,in_R8);
    local_150.data_ = (uint8_t *)CONCAT71(local_150.data_._1_7_,(char)iVar1);
    beast::unit_test::suite::expect<bool>
              (&this->super_suite,(bool *)&local_150,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x102);
    std::__cxx11::string::~string((string *)&local_100);
    STObject::~STObject(&local_130);
    std::__cxx11::string::~string((string *)local_e0);
    SecretKey::~SecretKey(&local_88);
  }
  return;
}

Assistant:

void
    testRevoke ()
    {
        testcase ("Revoke");

        for (auto const keyType : keyTypes)
        {
            ValidatorKeys keys (keyType);

            auto const revocation = keys.revoke ();

            STObject st (sfGeneric);
            auto const manifest = beast::detail::base64_decode(revocation);
            SerialIter sit (manifest.data (), manifest.size ());
            st.set (sit);

            auto const seq = get (st, sfSequence);
            BEAST_EXPECT (seq);
            BEAST_EXPECT (*seq == std::numeric_limits<std::uint32_t>::max ());

            auto const pk = get (st, sfPublicKey);
            BEAST_EXPECT (pk);
            BEAST_EXPECT (*pk == keys.publicKey ());
            BEAST_EXPECT (verify (
                st, HashPrefix::manifest, keys.publicKey (),
                sfMasterSignature));
        }
    }